

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

void __thiscall TMndxSearch::TMndxSearch(TMndxSearch *this)

{
  TMndxSearch *this_local;
  
  this->szSearchMask = (char *)0x0;
  this->cchSearchMask = 0;
  this->szFoundPath = (char *)0x0;
  this->cchFoundPath = 0;
  this->FileNameIndex = 0;
  this->pStruct40 = (TStruct40 *)0x0;
  return;
}

Assistant:

TMndxSearch()
    {
        szSearchMask = NULL;
        cchSearchMask = 0;
        szFoundPath = NULL;
        cchFoundPath = 0;
        FileNameIndex = 0;
        pStruct40 = NULL;
    }